

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveHyper(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *tol)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  pointer pnVar6;
  undefined8 uVar7;
  int *piVar8;
  type_conflict5 tVar9;
  double *pdVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  ulong uVar12;
  int local_2bc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_278;
  DIdxSet *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  steeppr local_1a8 [8];
  uint auStack_1a0 [2];
  uint local_198 [2];
  undefined8 uStack_190;
  undefined8 local_188;
  int local_180;
  undefined1 local_17c;
  fpclass_type local_178;
  uint local_174;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar6 = (pSVar4->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  pdVar10 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_228,-*pdVar10,(type *)0x0);
  uVar11 = (ulong)(uint)(this->bestPrices).super_IdxSet.num;
  local_2bc = -1;
  local_278 = this;
LAB_00235999:
  uVar12 = uVar11 & 0xffffffff;
  while( true ) {
    uVar11 = uVar11 - 1;
    if ((int)uVar12 < 1) {
      local_270 = &local_278->bestPrices;
      uVar11 = (ulong)(uint)(((local_278->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->updateViols).super_IdxSet.num;
      goto LAB_00235ce6;
    }
    iVar2 = (local_278->bestPrices).super_IdxSet.idx[uVar11];
    local_270 = (DIdxSet *)CONCAT44(local_270._4_4_,iVar2);
    uVar7 = *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 0x20);
    local_2b8.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_2b8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[iVar2].m_backend.data;
    local_2b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar6[iVar2].m_backend.data + 0x10);
    local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    local_2b8.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_2b8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_2b8.m_backend.exp = pnVar6[iVar2].m_backend.exp;
    local_2b8.m_backend.neg = pnVar6[iVar2].m_backend.neg;
    local_2b8.m_backend.fpclass = pnVar6[iVar2].m_backend.fpclass;
    local_2b8.m_backend.prec_elem = pnVar6[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (tol->m_backend).exp;
    result.m_backend.neg = (tol->m_backend).neg;
    result.m_backend.fpclass = (tol->m_backend).fpclass;
    result.m_backend.prec_elem = (tol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar9 = boost::multiprecision::operator<(&local_2b8,&result);
    if (tVar9) break;
    piVar8 = (local_278->bestPrices).super_IdxSet.idx;
    iVar3 = (local_278->bestPrices).super_IdxSet.num;
    (local_278->bestPrices).super_IdxSet.num = iVar3 + -1;
    piVar8[uVar11] = piVar8[(long)iVar3 + -1];
    (((local_278->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data[iVar2] = 0;
    uVar12 = (ulong)((int)uVar12 - 1);
  }
  uStack_50 = CONCAT35(local_2b8.m_backend.data._M_elems[7]._1_3_,
                       local_2b8.m_backend.data._M_elems._24_5_);
  local_68 = (steeppr  [8])local_2b8.m_backend.data._M_elems._0_8_;
  auStack_60[0] = local_2b8.m_backend.data._M_elems[2];
  auStack_60[1] = local_2b8.m_backend.data._M_elems[3];
  local_58[0] = local_2b8.m_backend.data._M_elems[4];
  local_58[1] = local_2b8.m_backend.data._M_elems[5];
  local_48 = CONCAT35(local_2b8.m_backend.data._M_elems[9]._1_3_,
                      local_2b8.m_backend.data._M_elems._32_5_);
  local_40 = local_2b8.m_backend.exp;
  local_3c = local_2b8.m_backend.neg;
  local_38 = local_2b8.m_backend.fpclass;
  iStack_34 = local_2b8.m_backend.prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
  local_a8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
  local_a8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
  local_a8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
  local_a8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (tol->m_backend).exp;
  local_e8.m_backend.neg = (tol->m_backend).neg;
  local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
  steeppr::
  computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&result,local_68,&local_a8,&local_e8,in_R8);
  local_2b8.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_2b8.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_2b8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_2b8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_2b8.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
  local_2b8.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
  local_2b8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_2b8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_2b8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_2b8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_2b8.m_backend.exp = result.m_backend.exp;
  local_2b8.m_backend.neg = result.m_backend.neg;
  local_2b8.m_backend.fpclass = result.m_backend.fpclass;
  local_2b8.m_backend.prec_elem = result.m_backend.prec_elem;
  tVar9 = boost::multiprecision::operator>
                    (&local_2b8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_228);
  if (tVar9) {
    local_228.data._M_elems[9]._1_3_ = local_2b8.m_backend.data._M_elems[9]._1_3_;
    local_228.data._M_elems._32_5_ = local_2b8.m_backend.data._M_elems._32_5_;
    local_228.data._M_elems[7]._1_3_ = local_2b8.m_backend.data._M_elems[7]._1_3_;
    local_228.data._M_elems._24_5_ = local_2b8.m_backend.data._M_elems._24_5_;
    local_228.data._M_elems[4] = local_2b8.m_backend.data._M_elems[4];
    local_228.data._M_elems[5] = local_2b8.m_backend.data._M_elems[5];
    local_228.data._M_elems[0] = local_2b8.m_backend.data._M_elems[0];
    local_228.data._M_elems[1] = local_2b8.m_backend.data._M_elems[1];
    local_228.data._M_elems[2] = local_2b8.m_backend.data._M_elems[2];
    local_228.data._M_elems[3] = local_2b8.m_backend.data._M_elems[3];
    local_228.exp = local_2b8.m_backend.exp;
    local_228.neg = local_2b8.m_backend.neg;
    local_228.fpclass = local_2b8.m_backend.fpclass;
    local_228.prec_elem = local_2b8.m_backend.prec_elem;
    local_2bc = (int)local_270;
  }
  tVar9 = boost::multiprecision::operator<
                    (&local_2b8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1e8);
  if (!tVar9) goto code_r0x00235c61;
  goto LAB_00235c7b;
LAB_00235ce6:
  uVar12 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    if ((int)uVar12 < 1) {
      return local_2bc;
    }
    pSVar4 = (local_278->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    iVar2 = (pSVar4->updateViols).super_IdxSet.idx[uVar11];
    if ((pSVar4->isInfeasible).data[iVar2] == 1) {
      local_188 = *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 0x20);
      local_2b8.m_backend.data._M_elems._32_5_ = SUB85(local_188,0);
      local_2b8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_188 >> 0x28);
      local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[iVar2].m_backend.data;
      local_2b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar6[iVar2].m_backend.data + 0x10);
      local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uStack_190 = *(undefined8 *)(puVar1 + 2);
      local_2b8.m_backend.data._M_elems._24_5_ = SUB85(uStack_190,0);
      local_2b8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_190 >> 0x28);
      local_2b8.m_backend.exp = pnVar6[iVar2].m_backend.exp;
      local_2b8.m_backend.neg = pnVar6[iVar2].m_backend.neg;
      local_178 = pnVar6[iVar2].m_backend.fpclass;
      local_174 = pnVar6[iVar2].m_backend.prec_elem;
      local_2b8.m_backend.prec_elem = local_174;
      local_2b8.m_backend.fpclass = local_178;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
      local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
      local_128.m_backend.exp = pnVar5[iVar2].m_backend.exp;
      local_128.m_backend.neg = pnVar5[iVar2].m_backend.neg;
      local_128.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
      local_128.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
      local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8)
      ;
      local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4)
      ;
      local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6)
      ;
      local_168.m_backend.exp = (tol->m_backend).exp;
      local_168.m_backend.neg = (tol->m_backend).neg;
      local_168.m_backend.fpclass = (tol->m_backend).fpclass;
      local_168.m_backend.prec_elem = (tol->m_backend).prec_elem;
      local_1a8 = (steeppr  [8])local_2b8.m_backend.data._M_elems._0_8_;
      auStack_1a0 = (uint  [2])local_2b8.m_backend.data._M_elems._8_8_;
      local_198 = (uint  [2])local_2b8.m_backend.data._M_elems._16_8_;
      local_180 = local_2b8.m_backend.exp;
      local_17c = local_2b8.m_backend.neg;
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_1a8,&local_128,&local_168,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)local_174);
      local_2b8.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_2b8.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_2b8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_2b8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_2b8.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_2b8.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_2b8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_2b8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_2b8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_2b8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_2b8.m_backend.exp = result.m_backend.exp;
      local_2b8.m_backend.neg = result.m_backend.neg;
      local_2b8.m_backend.fpclass = result.m_backend.fpclass;
      local_2b8.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar9 = boost::multiprecision::operator>
                        (&local_2b8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1e8);
      if (tVar9) break;
    }
    uVar12 = (ulong)((int)uVar12 - 1);
  } while( true );
  tVar9 = boost::multiprecision::operator>
                    (&local_2b8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_228);
  if (tVar9) {
    local_228.data._M_elems[9]._1_3_ = local_2b8.m_backend.data._M_elems[9]._1_3_;
    local_228.data._M_elems._32_5_ = local_2b8.m_backend.data._M_elems._32_5_;
    local_228.data._M_elems[7]._1_3_ = local_2b8.m_backend.data._M_elems[7]._1_3_;
    local_228.data._M_elems._24_5_ = local_2b8.m_backend.data._M_elems._24_5_;
    local_228.data._M_elems[4] = local_2b8.m_backend.data._M_elems[4];
    local_228.data._M_elems[5] = local_2b8.m_backend.data._M_elems[5];
    local_228.data._M_elems[0] = local_2b8.m_backend.data._M_elems[0];
    local_228.data._M_elems[1] = local_2b8.m_backend.data._M_elems[1];
    local_228.data._M_elems[2] = local_2b8.m_backend.data._M_elems[2];
    local_228.data._M_elems[3] = local_2b8.m_backend.data._M_elems[3];
    local_228.exp = local_2b8.m_backend.exp;
    local_228.neg = local_2b8.m_backend.neg;
    local_228.fpclass = local_2b8.m_backend.fpclass;
    local_228.prec_elem = local_2b8.m_backend.prec_elem;
    local_2bc = iVar2;
  }
  (((local_278->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thesolver)->isInfeasible).data[iVar2] = 2;
  DIdxSet::addIdx(local_270,iVar2);
  goto LAB_00235ce6;
code_r0x00235c61:
  result.m_backend.data._M_elems._0_8_ = result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar9 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1e8,(int *)&result);
  if (tVar9) {
LAB_00235c7b:
    local_1e8.data._M_elems[9]._1_3_ = local_2b8.m_backend.data._M_elems[9]._1_3_;
    local_1e8.data._M_elems._32_5_ = local_2b8.m_backend.data._M_elems._32_5_;
    local_1e8.data._M_elems[0] = local_2b8.m_backend.data._M_elems[0];
    local_1e8.data._M_elems[1] = local_2b8.m_backend.data._M_elems[1];
    local_1e8.data._M_elems[2] = local_2b8.m_backend.data._M_elems[2];
    local_1e8.data._M_elems[3] = local_2b8.m_backend.data._M_elems[3];
    local_1e8.data._M_elems[4] = local_2b8.m_backend.data._M_elems[4];
    local_1e8.data._M_elems[5] = local_2b8.m_backend.data._M_elems[5];
    local_1e8.data._M_elems[7]._1_3_ = local_2b8.m_backend.data._M_elems[7]._1_3_;
    local_1e8.data._M_elems._24_5_ = local_2b8.m_backend.data._M_elems._24_5_;
    local_1e8.exp = local_2b8.m_backend.exp;
    local_1e8.neg = local_2b8.m_backend.neg;
    local_1e8.fpclass = local_2b8.m_backend.fpclass;
    local_1e8.prec_elem = local_2b8.m_backend.prec_elem;
  }
  goto LAB_00235999;
}

Assistant:

int SPxSteepPR<R>::selectLeaveHyper(R tol)
{
   const R* coPen = this->thesolver->coWeights.get_const_ptr();
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   R leastBest = -1;
   R best = R(-infinity);
   R x;
   int bestIdx = -1;
   int idx = 0;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         x = steeppr::computePrice(x, coPen[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bestIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // is this index a candidate for bestPrices?
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -tol);
         x = steeppr::computePrice(x, coPen[idx], tol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bestIdx = idx;
            }

            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bestIdx;
}